

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_number_to_string.c
# Opt level: O2

size_t cesl_int_to_str(int value,char *dst_str,uint8_t base)

{
  char cVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  undefined7 in_register_00000011;
  size_t sVar8;
  char acStack_28 [40];
  
  iVar7 = (int)CONCAT71(in_register_00000011,base);
  uVar4 = (ulong)(uint)-value;
  if (-1 < value || iVar7 != 10) {
    uVar4 = (ulong)(uint)value;
  }
  for (sVar8 = 0; iVar3 = (int)uVar4, sVar8 == 0 || iVar3 != 0; sVar8 = sVar8 + 1) {
    uVar4 = (long)iVar3 / (long)iVar7 & 0xffffffff;
    cVar1 = (char)(iVar3 % iVar7);
    cVar2 = 'W';
    if (cVar1 < '\n') {
      cVar2 = '0';
    }
    acStack_28[sVar8] = cVar2 + cVar1;
  }
  if ((long)sVar8 < 1) {
    __assert_fail("(len > 0)&&(\"cesl_int32_to_str negative lenght\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_strings/cesl_number_to_string.c"
                  ,0x49,"size_t cesl_int32_to_str(int32_t, char *, uint8_t)");
  }
  sVar5 = sVar8;
  if (-1 >= value && iVar7 == 10) {
    *dst_str = '-';
    dst_str = dst_str + 1;
    sVar5 = sVar8 + 1;
  }
  for (pcVar6 = acStack_28 + sVar8; acStack_28 < pcVar6; pcVar6 = pcVar6 + -1) {
    *dst_str = pcVar6[-1];
    dst_str = dst_str + 1;
  }
  *dst_str = '\0';
  return sVar5;
}

Assistant:

size_t cesl_int_to_str(int value, char* dst_str, uint8_t base)
{
#if (INT_MAX == INT64_MAX)
    return cesl_int64_to_str(value, dst_str, base);
#elif (INT_MAX == INT32_MAX)
    return cesl_int32_to_str(value, dst_str, base);
#else
#error cesl_int_to_string__not_supported_on_this_platfform
#endif
}